

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  tile_details *ptVar1;
  long lVar2;
  uint i;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint16 uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint local_38;
  
  uVar11 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar4 = (ulong)(this->m_tiles).m_size;
  uVar5 = (uVar4 * data) / uVar11;
  do {
    local_38 = (uint)(((data + 1) * uVar4) / uVar11);
    if (local_38 <= (uint)uVar5) {
      return;
    }
    ptVar1 = (this->m_tiles).m_p;
    uVar6 = uVar5 & 0xffffffff;
    if (ptVar1[uVar6].pixels.m_size != 0) {
      uVar3 = tree_clusterizer<crnlib::vec<6U,_float>_>::get_node_index
                        ((tree_clusterizer<crnlib::vec<6U,_float>_> *)pData_ptr,
                         &ptVar1[uVar6].color_endpoint);
      fVar12 = vec<6U,_float>::squared_distance
                         ((vec<6U,_float> *)
                          ((ulong)uVar3 * 0x18 + *(long *)((long)pData_ptr + 0x98)),
                          &ptVar1[uVar6].color_endpoint);
      lVar8 = 0x14;
      uVar10 = 0;
      fVar13 = 1e+37;
      for (uVar7 = 0; uVar9 = (uint16)uVar10, *(uint *)((long)pData_ptr + 0xa0) != uVar7;
          uVar7 = uVar7 + 1) {
        lVar2 = *(long *)((long)pData_ptr + 0x98);
        fVar15 = *(float *)(lVar2 + -0x14 + lVar8) - ptVar1[uVar6].color_endpoint.m_s[0];
        fVar14 = *(float *)(lVar2 + -0x10 + lVar8) - ptVar1[uVar6].color_endpoint.m_s[1];
        fVar14 = fVar14 * fVar14 + fVar15 * fVar15 + 0.0;
        if (((fVar14 <= fVar12) &&
            (fVar16 = *(float *)(lVar2 + -0xc + lVar8) - ptVar1[uVar6].color_endpoint.m_s[2],
            fVar15 = *(float *)(lVar2 + -8 + lVar8) - ptVar1[uVar6].color_endpoint.m_s[3],
            fVar14 = fVar15 * fVar15 + fVar16 * fVar16 + fVar14, fVar14 <= fVar12)) &&
           (fVar16 = *(float *)(lVar2 + -4 + lVar8) - ptVar1[uVar6].color_endpoint.m_s[4],
           fVar15 = *(float *)(lVar2 + lVar8) - ptVar1[uVar6].color_endpoint.m_s[5],
           fVar14 = fVar15 * fVar15 + fVar16 * fVar16 + fVar14, fVar14 < fVar13)) {
          if ((fVar14 == 0.0) && (!NAN(fVar14))) {
            uVar9 = (uint16)uVar7;
            break;
          }
          uVar10 = uVar7 & 0xffffffff;
          fVar13 = fVar14;
        }
        lVar8 = lVar8 + 0x18;
      }
      (this->m_tiles).m_p[uVar6].cluster_indices[0] = uVar9;
    }
    uVar5 = (ulong)((uint)uVar5 + 1);
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr)
    {
        tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
        const crnlib::vector<vec6F>& codebook = vq->get_codebook();
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                const vec6F& v = m_tiles[t].color_endpoint;
                float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
                float best_dist = math::cNearlyInfinite;
                uint best_index = 0;
                for (uint i = 0; i < codebook.size(); i++)
                {
                    const vec6F& c = codebook[i];
                    float dist = 0;
                    float d0 = c[0] - v[0];
                    dist += d0 * d0;
                    float d1 = c[1] - v[1];
                    dist += d1 * d1;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d2 = c[2] - v[2];
                    dist += d2 * d2;
                    float d3 = c[3] - v[3];
                    dist += d3 * d3;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d4 = c[4] - v[4];
                    dist += d4 * d4;
                    float d5 = c[5] - v[5];
                    dist += d5 * d5;
                    if (dist < best_dist)
                    {
                        best_dist = dist;
                        best_index = i;
                        if (best_dist == 0.0f)
                        {
                            break;
                        }
                    }
                }
                m_tiles[t].cluster_indices[cColor] = best_index;
            }
        }
    }